

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Base.cpp
# Opt level: O1

void __thiscall
chrono::ChFunction::Estimate_y_range
          (ChFunction *this,double xmin,double xmax,double *ymin,double *ymax,int derivate)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double local_38;
  
  *ymin = 10000.0;
  *ymax = -10000.0;
  if (xmin < xmax) {
    local_38 = xmin;
    do {
      dVar2 = local_38;
      (*this->_vptr_ChFunction[10])(this,(ulong)(uint)derivate);
      if (dVar2 < *ymin) {
        dVar2 = local_38;
        (*this->_vptr_ChFunction[10])(this,(ulong)(uint)derivate);
        *ymin = dVar2;
      }
      dVar2 = local_38;
      (*this->_vptr_ChFunction[10])(this,(ulong)(uint)derivate);
      if (*ymax < dVar2) {
        dVar2 = local_38;
        (*this->_vptr_ChFunction[10])(this,(ulong)(uint)derivate);
        *ymax = dVar2;
      }
      local_38 = local_38 + (xmax - xmin) / 100.0;
    } while (local_38 < xmax);
  }
  auVar1._8_8_ = 0x7fffffffffffffff;
  auVar1._0_8_ = 0x7fffffffffffffff;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *ymax - *ymin;
  auVar1 = vandpd_avx512vl(auVar3,auVar1);
  if (auVar1._0_8_ < 1e-11) {
    *ymin = -0.5;
    *ymax = 1.0;
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *ymax;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *ymax - *ymin;
  auVar1 = vfmadd132sd_fma(auVar6,auVar4,ZEXT816(0x3fbeb851eb851eb8));
  *ymax = auVar1._0_8_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *ymin;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = auVar1._0_8_ - *ymin;
  auVar1 = vfmadd132sd_fma(auVar7,auVar5,ZEXT816(0xbfbeb851eb851eb8));
  *ymin = auVar1._0_8_;
  return;
}

Assistant:

void ChFunction::Estimate_y_range(double xmin, double xmax, double& ymin, double& ymax, int derivate) const {
    ymin = 10000;
    ymax = -10000;
    for (double mx = xmin; mx < xmax; mx += (xmax - xmin) / 100.0) {
        if (Get_y_dN(mx, derivate) < ymin)
            ymin = Get_y_dN(mx, derivate);
        if (Get_y_dN(mx, derivate) > ymax)
            ymax = Get_y_dN(mx, derivate);
    }
    if (fabs(ymax - ymin) < 10e-12) {
        ymin = -0.5;
        ymax = +1.0;
    }
    ymax += 0.12 * (ymax - ymin);
    ymin -= 0.12 * (ymax - ymin);
}